

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretbox.h
# Opt level: O3

int hydro_secretbox_probe_verify(uint8_t *probe,uint8_t *c,size_t c_len,char *ctx,uint8_t *key)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  uint8_t *b1;
  uint8_t computed_probe [16];
  byte local_28 [24];
  
  iVar4 = -1;
  if (0x23 < c_len) {
    hydro_hash_hash(local_28,0x10,c + 0x14,0x10,ctx,key);
    lVar5 = 0;
    bVar3 = -(local_28 == probe);
    do {
      pbVar1 = local_28 + lVar5;
      pbVar2 = probe + lVar5;
      lVar5 = lVar5 + 1;
      bVar3 = bVar3 | *pbVar1 ^ *pbVar2;
    } while (lVar5 != 0x10);
    iVar4 = 0;
    if ((bVar3 - 1 >> 8 & 1) == 0) {
      lVar5 = 0;
      do {
        local_28[lVar5] = 0;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x10);
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

int
hydro_secretbox_probe_verify(const uint8_t probe[hydro_secretbox_PROBEBYTES], const uint8_t *c,
                             size_t c_len, const char ctx[hydro_secretbox_CONTEXTBYTES],
                             const uint8_t key[hydro_secretbox_KEYBYTES])
{
    uint8_t        computed_probe[hydro_secretbox_PROBEBYTES];
    const uint8_t *mac;

    if (c_len < hydro_secretbox_HEADERBYTES) {
        return -1;
    }
    mac = &c[hydro_secretbox_SIVBYTES];
    hydro_hash_hash(computed_probe, hydro_secretbox_PROBEBYTES, mac, hydro_secretbox_MACBYTES, ctx,
                    key);
    if (hydro_equal(computed_probe, probe, hydro_secretbox_PROBEBYTES) == 1) {
        return 0;
    }
    hydro_memzero(computed_probe, hydro_secretbox_PROBEBYTES);
    return -1;
}